

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
n_pca::NPca::getLabelMap
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NPca *this,string *label_path)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  int local_274;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string input_str;
  ifstream file;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (label_path->_M_string_length == 0) {
    puts("couldn\'t find label_path");
  }
  else {
    std::ifstream::ifstream(&file,(label_path->_M_dataplus)._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      printf("couldn\'t open label_path: %s\n",(label_path->_M_dataplus)._M_p);
    }
    else {
      input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
      input_str._M_string_length = 0;
      input_str.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&input_str);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        NConfig::n_split(&tokens,this->n_config_,&input_str,':');
        local_274 = atoi(((tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_274);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tokens);
      }
      std::__cxx11::string::~string((string *)&input_str);
    }
    std::ifstream::~ifstream(&file);
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, string> NPca::getLabelMap(const string label_path)
{
    map<int, string> label_map;

    if (label_path.length() <= 0)
    {
        printf("couldn't find label_path\n");
        return label_map;
    }

    ifstream file(label_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open label_path: %s\n", label_path.c_str());
        return label_map;
    }

    string input_str;
    while (getline(file, input_str))
    {
        vector<string> tokens = n_config_->n_split(input_str, ':');
        label_map[atoi(tokens[0].c_str())] = tokens[1];
    }

    return label_map;
}